

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

bool __thiscall
libcellml::Validator::ValidatorImpl::hasOneOrTwoMathmlChildren
          (ValidatorImpl *this,XmlNodePtr *node,ComponentPtr *component)

{
  size_t sVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  string local_48;
  
  sVar1 = mathmlChildCount(node);
  if (1 < sVar1 - 1) {
    XmlNode::name_abi_cxx11_
              (&local_48,
               (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x2a8b56);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_78 = *plVar3;
      lStack_70 = plVar2[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar3;
      local_88 = (long *)*plVar2;
    }
    local_80 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_88);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_68.field_2._M_allocated_capacity = *psVar4;
      local_68.field_2._8_8_ = plVar2[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar4;
      local_68._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_68._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    addMathmlIssue(this,&local_68,MATH_MATHML,component);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return sVar1 - 1 < 2;
}

Assistant:

bool Validator::ValidatorImpl::hasOneOrTwoMathmlChildren(const XmlNodePtr &node,
                                                         const ComponentPtr &component)
{
    auto childCount = mathmlChildCount(node);

    if ((childCount != 1) && (childCount != 2)) {
        addMathmlIssue("Math has a '" + node->name() + "' element without exactly one or two MathML children.",
                       Issue::ReferenceRule::MATH_MATHML,
                       component);

        return false;
    }

    return true;
}